

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_wav_read_pcm_frames_s16__msadpcm
                    (ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int16 *pBufferOut)

{
  ma_uint32 *pmVar1;
  ushort uVar2;
  int iVar3;
  byte bVar4;
  size_t sVar5;
  int iVar6;
  ma_uint32 mVar7;
  ma_uint64 mVar8;
  ma_uint64 mVar9;
  ma_uint64 mVar10;
  uint uVar11;
  int iVar12;
  ma_uint64 mVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  ma_int32 mVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ma_uint64 mVar22;
  bool bVar23;
  ma_uint8 header [7];
  byte local_46;
  byte local_45;
  byte local_44;
  byte local_43;
  byte local_42;
  byte local_41;
  byte local_40;
  byte local_3f;
  byte local_3e;
  byte local_3d;
  byte local_3c;
  byte local_3b;
  byte local_3a;
  byte local_39;
  ma_uint64 local_38;
  
  if (pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
    pmVar1 = &(pWav->msadpcm).cachedFrameCount;
    mVar9 = 0;
    do {
      if ((*pmVar1 == 0) && ((pWav->msadpcm).bytesRemainingInBlock == 0)) {
        if (pWav->channels == 1) {
          sVar5 = (*pWav->onRead)(pWav->pUserData,&local_46,7);
          if (sVar5 == 7) {
            (pWav->msadpcm).bytesRemainingInBlock = (pWav->fmt).blockAlign - 7;
            (pWav->msadpcm).predictor[0] = (ushort)local_46;
            (pWav->msadpcm).delta[0] = (int)(short)((ushort)local_44 << 8) | (uint)local_45;
            uVar11 = (int)(short)((ushort)local_42 << 8) | (uint)local_43;
            (pWav->msadpcm).prevFrames[0][1] = uVar11;
            uVar14 = (int)(short)((ushort)local_40 << 8) | (uint)local_41;
            bVar23 = local_46 < 7;
            (pWav->msadpcm).prevFrames[0][0] = uVar14;
            (pWav->msadpcm).cachedFrames[2] = uVar14;
            (pWav->msadpcm).cachedFrames[3] = uVar11;
            (pWav->msadpcm).cachedFrameCount = 2;
            if (!bVar23) {
              local_38 = mVar9;
            }
          }
          else {
LAB_001757c2:
            bVar23 = false;
            local_38 = mVar9;
          }
        }
        else {
          sVar5 = (*pWav->onRead)(pWav->pUserData,&local_46,0xe);
          if (sVar5 != 0xe) goto LAB_001757c2;
          (pWav->msadpcm).bytesRemainingInBlock = (pWav->fmt).blockAlign - 0xe;
          (pWav->msadpcm).predictor[0] = (ushort)local_46;
          (pWav->msadpcm).predictor[1] = (ushort)local_45;
          (pWav->msadpcm).delta[0] = (int)(short)((ushort)local_43 << 8) | (uint)local_44;
          (pWav->msadpcm).delta[1] = (int)(short)((ushort)local_41 << 8) | (uint)local_42;
          uVar11 = (int)(short)((ushort)local_3f << 8) | (uint)local_40;
          (pWav->msadpcm).prevFrames[0][1] = uVar11;
          uVar14 = (int)(short)((ushort)local_3d << 8) | (uint)local_3e;
          (pWav->msadpcm).prevFrames[1][1] = uVar14;
          uVar17 = (int)(short)((ushort)local_3b << 8) | (uint)local_3c;
          (pWav->msadpcm).prevFrames[0][0] = uVar17;
          uVar20 = (int)(short)((ushort)local_39 << 8) | (uint)local_3a;
          (pWav->msadpcm).prevFrames[1][0] = uVar20;
          (pWav->msadpcm).cachedFrames[0] = uVar17;
          (pWav->msadpcm).cachedFrames[1] = uVar20;
          (pWav->msadpcm).cachedFrames[2] = uVar11;
          (pWav->msadpcm).cachedFrames[3] = uVar14;
          (pWav->msadpcm).cachedFrameCount = 2;
          if (local_46 < 7) {
            bVar23 = local_45 < 7;
            if (!bVar23) {
              local_38 = mVar9;
            }
          }
          else {
            bVar23 = false;
            local_38 = mVar9;
          }
        }
        if (!bVar23) {
          return local_38;
        }
      }
      if (framesToRead == 0) {
        return mVar9;
      }
      uVar15 = (ulong)*pmVar1;
      mVar10 = mVar9 + uVar15;
      mVar8 = framesToRead - uVar15;
      mVar13 = mVar9;
      mVar22 = framesToRead;
      while( true ) {
        iVar12 = (int)uVar15;
        if (iVar12 == 0) break;
        uVar15 = pWav->readCursorInPCMFrames;
        if (pWav->totalPCMFrameCount <= uVar15) {
          mVar10 = mVar13;
          mVar8 = mVar22;
          if (iVar12 != 0) goto LAB_00175b31;
          break;
        }
        if (pBufferOut == (ma_int16 *)0x0) {
          pBufferOut = (ma_int16 *)0x0;
        }
        else {
          uVar21 = (ulong)pWav->channels;
          if (pWav->channels != 0) {
            uVar19 = 0;
            do {
              pBufferOut[uVar19] = (ma_int16)pmVar1[uVar19 - (uint)((int)uVar21 * iVar12)];
              uVar19 = uVar19 + 1;
              uVar21 = (ulong)pWav->channels;
            } while (uVar19 < uVar21);
          }
          pBufferOut = pBufferOut + uVar21;
        }
        mVar13 = mVar13 + 1;
        pWav->readCursorInPCMFrames = uVar15 + 1;
        (pWav->msadpcm).cachedFrameCount = iVar12 - 1U;
        uVar15 = (ulong)(iVar12 - 1U);
        mVar22 = mVar22 - 1;
        if (mVar22 == 0) {
          return framesToRead + mVar9;
        }
      }
      if ((pWav->msadpcm).bytesRemainingInBlock != 0) {
        sVar5 = (*pWav->onRead)(pWav->pUserData,&local_46,1);
        mVar9 = mVar10;
        if (sVar5 == 1) {
          (pWav->msadpcm).bytesRemainingInBlock = (pWav->msadpcm).bytesRemainingInBlock - 1;
          bVar4 = local_46 >> 4;
          uVar11 = (int)(char)(bVar4 - 0x10);
          if (-1 < (char)local_46) {
            uVar11 = (uint)bVar4;
          }
          uVar14 = (int)((uint)local_46 << 0x1c) >> 0x1f & 0xfffffff0U | local_46 & 0xf;
          if (pWav->channels == 1) {
            iVar12 = (pWav->msadpcm).prevFrames[0][1];
            uVar2 = (pWav->msadpcm).predictor[0];
            iVar16 = (pWav->msadpcm).delta[0];
            iVar6 = uVar11 * iVar16 +
                    ((pWav->msadpcm).prevFrames[0][0] *
                     ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff2Table[uVar2] +
                     ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff1Table[uVar2] * iVar12 >> 8);
            if (0x7ffe < iVar6) {
              iVar6 = 0x7fff;
            }
            if (iVar6 < -0x7fff) {
              iVar6 = -0x8000;
            }
            iVar16 = ma_dr_wav_read_pcm_frames_s16__msadpcm::adaptationTable[bVar4] * iVar16 >> 8;
            if (iVar16 < 0x11) {
              iVar16 = 0x10;
            }
            iVar12 = uVar14 * iVar16 +
                     (ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff2Table[uVar2] * iVar12 +
                      ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff1Table[uVar2] * iVar6 >> 8);
            if (0x7ffe < iVar12) {
              iVar12 = 0x7fff;
            }
            if (iVar12 < -0x7fff) {
              iVar12 = -0x8000;
            }
            iVar16 = iVar16 * ma_dr_wav_read_pcm_frames_s16__msadpcm::adaptationTable
                              [local_46 & 0xf] >> 8;
            if (iVar16 < 0x11) {
              iVar16 = 0x10;
            }
            (pWav->msadpcm).delta[0] = iVar16;
            (pWav->msadpcm).prevFrames[0][0] = iVar6;
            (pWav->msadpcm).prevFrames[0][1] = iVar12;
            (pWav->msadpcm).cachedFrames[2] = iVar6;
            (pWav->msadpcm).cachedFrames[3] = iVar12;
            mVar7 = 2;
          }
          else {
            iVar12 = (pWav->msadpcm).prevFrames[0][1];
            uVar2 = (pWav->msadpcm).predictor[0];
            iVar16 = (pWav->msadpcm).delta[0];
            iVar6 = uVar11 * iVar16 +
                    (ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff2Table[uVar2] *
                     (pWav->msadpcm).prevFrames[0][0] +
                     ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff1Table[uVar2] * iVar12 >> 8);
            if (0x7ffe < iVar6) {
              iVar6 = 0x7fff;
            }
            if (iVar6 < -0x7fff) {
              iVar6 = -0x8000;
            }
            iVar3 = (pWav->msadpcm).delta[1];
            iVar16 = ma_dr_wav_read_pcm_frames_s16__msadpcm::adaptationTable[bVar4] * iVar16 >> 8;
            if (iVar16 < 0x11) {
              iVar16 = 0x10;
            }
            (pWav->msadpcm).delta[0] = iVar16;
            (pWav->msadpcm).prevFrames[0][0] = iVar12;
            (pWav->msadpcm).prevFrames[0][1] = iVar6;
            iVar12 = (pWav->msadpcm).prevFrames[1][1];
            uVar2 = (pWav->msadpcm).predictor[1];
            iVar16 = uVar14 * iVar3 +
                     (ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff2Table[uVar2] *
                      (pWav->msadpcm).prevFrames[1][0] +
                      ma_dr_wav_read_pcm_frames_s16__msadpcm::coeff1Table[uVar2] * iVar12 >> 8);
            if (0x7ffe < iVar16) {
              iVar16 = 0x7fff;
            }
            if (iVar16 < -0x7fff) {
              iVar16 = -0x8000;
            }
            mVar18 = iVar3 * ma_dr_wav_read_pcm_frames_s16__msadpcm::adaptationTable[local_46 & 0xf]
                     >> 8;
            if (mVar18 < 0x11) {
              mVar18 = 0x10;
            }
            (pWav->msadpcm).delta[1] = mVar18;
            (pWav->msadpcm).prevFrames[1][0] = iVar12;
            (pWav->msadpcm).prevFrames[1][1] = iVar16;
            (pWav->msadpcm).cachedFrames[2] = iVar6;
            (pWav->msadpcm).cachedFrames[3] = iVar16;
            mVar7 = 1;
          }
          *pmVar1 = mVar7;
          mVar9 = local_38;
        }
        local_38 = mVar9;
        if (sVar5 != 1) {
          return mVar9;
        }
      }
LAB_00175b31:
      mVar9 = mVar10;
      framesToRead = mVar8;
    } while (pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount);
  }
  else {
    mVar10 = 0;
  }
  return mVar10;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav_read_pcm_frames_s16__msadpcm(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int16* pBufferOut)
{
    ma_uint64 totalFramesRead = 0;
    static ma_int32 adaptationTable[] = {
        230, 230, 230, 230, 307, 409, 512, 614,
        768, 614, 512, 409, 307, 230, 230, 230
    };
    static ma_int32 coeff1Table[] = { 256, 512, 0, 192, 240, 460,  392 };
    static ma_int32 coeff2Table[] = { 0,  -256, 0, 64,  0,  -208, -232 };
    MA_DR_WAV_ASSERT(pWav != NULL);
    MA_DR_WAV_ASSERT(framesToRead > 0);
    while (pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
        MA_DR_WAV_ASSERT(framesToRead > 0);
        if (pWav->msadpcm.cachedFrameCount == 0 && pWav->msadpcm.bytesRemainingInBlock == 0) {
            if (pWav->channels == 1) {
                ma_uint8 header[7];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->msadpcm.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);
                pWav->msadpcm.predictor[0]     = header[0];
                pWav->msadpcm.delta[0]         = ma_dr_wav_bytes_to_s16(header + 1);
                pWav->msadpcm.prevFrames[0][1] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 3);
                pWav->msadpcm.prevFrames[0][0] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 5);
                pWav->msadpcm.cachedFrames[2]  = pWav->msadpcm.prevFrames[0][0];
                pWav->msadpcm.cachedFrames[3]  = pWav->msadpcm.prevFrames[0][1];
                pWav->msadpcm.cachedFrameCount = 2;
                if (pWav->msadpcm.predictor[0] >= ma_dr_wav_countof(coeff1Table)) {
                    return totalFramesRead;
                }
            } else {
                ma_uint8 header[14];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->msadpcm.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);
                pWav->msadpcm.predictor[0] = header[0];
                pWav->msadpcm.predictor[1] = header[1];
                pWav->msadpcm.delta[0] = ma_dr_wav_bytes_to_s16(header + 2);
                pWav->msadpcm.delta[1] = ma_dr_wav_bytes_to_s16(header + 4);
                pWav->msadpcm.prevFrames[0][1] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 6);
                pWav->msadpcm.prevFrames[1][1] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 8);
                pWav->msadpcm.prevFrames[0][0] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 10);
                pWav->msadpcm.prevFrames[1][0] = (ma_int32)ma_dr_wav_bytes_to_s16(header + 12);
                pWav->msadpcm.cachedFrames[0] = pWav->msadpcm.prevFrames[0][0];
                pWav->msadpcm.cachedFrames[1] = pWav->msadpcm.prevFrames[1][0];
                pWav->msadpcm.cachedFrames[2] = pWav->msadpcm.prevFrames[0][1];
                pWav->msadpcm.cachedFrames[3] = pWav->msadpcm.prevFrames[1][1];
                pWav->msadpcm.cachedFrameCount = 2;
                if (pWav->msadpcm.predictor[0] >= ma_dr_wav_countof(coeff1Table) || pWav->msadpcm.predictor[1] >= ma_dr_wav_countof(coeff2Table)) {
                    return totalFramesRead;
                }
            }
        }
        while (framesToRead > 0 && pWav->msadpcm.cachedFrameCount > 0 && pWav->readCursorInPCMFrames < pWav->totalPCMFrameCount) {
            if (pBufferOut != NULL) {
                ma_uint32 iSample = 0;
                for (iSample = 0; iSample < pWav->channels; iSample += 1) {
                    pBufferOut[iSample] = (ma_int16)pWav->msadpcm.cachedFrames[(ma_dr_wav_countof(pWav->msadpcm.cachedFrames) - (pWav->msadpcm.cachedFrameCount*pWav->channels)) + iSample];
                }
                pBufferOut += pWav->channels;
            }
            framesToRead    -= 1;
            totalFramesRead += 1;
            pWav->readCursorInPCMFrames += 1;
            pWav->msadpcm.cachedFrameCount -= 1;
        }
        if (framesToRead == 0) {
            break;
        }
        if (pWav->msadpcm.cachedFrameCount == 0) {
            if (pWav->msadpcm.bytesRemainingInBlock == 0) {
                continue;
            } else {
                ma_uint8 nibbles;
                ma_int32 nibble0;
                ma_int32 nibble1;
                if (pWav->onRead(pWav->pUserData, &nibbles, 1) != 1) {
                    return totalFramesRead;
                }
                pWav->msadpcm.bytesRemainingInBlock -= 1;
                nibble0 = ((nibbles & 0xF0) >> 4); if ((nibbles & 0x80)) { nibble0 |= 0xFFFFFFF0UL; }
                nibble1 = ((nibbles & 0x0F) >> 0); if ((nibbles & 0x08)) { nibble1 |= 0xFFFFFFF0UL; }
                if (pWav->channels == 1) {
                    ma_int32 newSample0;
                    ma_int32 newSample1;
                    newSample0  = ((pWav->msadpcm.prevFrames[0][1] * coeff1Table[pWav->msadpcm.predictor[0]]) + (pWav->msadpcm.prevFrames[0][0] * coeff2Table[pWav->msadpcm.predictor[0]])) >> 8;
                    newSample0 += nibble0 * pWav->msadpcm.delta[0];
                    newSample0  = ma_dr_wav_clamp(newSample0, -32768, 32767);
                    pWav->msadpcm.delta[0] = (adaptationTable[((nibbles & 0xF0) >> 4)] * pWav->msadpcm.delta[0]) >> 8;
                    if (pWav->msadpcm.delta[0] < 16) {
                        pWav->msadpcm.delta[0] = 16;
                    }
                    pWav->msadpcm.prevFrames[0][0] = pWav->msadpcm.prevFrames[0][1];
                    pWav->msadpcm.prevFrames[0][1] = newSample0;
                    newSample1  = ((pWav->msadpcm.prevFrames[0][1] * coeff1Table[pWav->msadpcm.predictor[0]]) + (pWav->msadpcm.prevFrames[0][0] * coeff2Table[pWav->msadpcm.predictor[0]])) >> 8;
                    newSample1 += nibble1 * pWav->msadpcm.delta[0];
                    newSample1  = ma_dr_wav_clamp(newSample1, -32768, 32767);
                    pWav->msadpcm.delta[0] = (adaptationTable[((nibbles & 0x0F) >> 0)] * pWav->msadpcm.delta[0]) >> 8;
                    if (pWav->msadpcm.delta[0] < 16) {
                        pWav->msadpcm.delta[0] = 16;
                    }
                    pWav->msadpcm.prevFrames[0][0] = pWav->msadpcm.prevFrames[0][1];
                    pWav->msadpcm.prevFrames[0][1] = newSample1;
                    pWav->msadpcm.cachedFrames[2] = newSample0;
                    pWav->msadpcm.cachedFrames[3] = newSample1;
                    pWav->msadpcm.cachedFrameCount = 2;
                } else {
                    ma_int32 newSample0;
                    ma_int32 newSample1;
                    newSample0  = ((pWav->msadpcm.prevFrames[0][1] * coeff1Table[pWav->msadpcm.predictor[0]]) + (pWav->msadpcm.prevFrames[0][0] * coeff2Table[pWav->msadpcm.predictor[0]])) >> 8;
                    newSample0 += nibble0 * pWav->msadpcm.delta[0];
                    newSample0  = ma_dr_wav_clamp(newSample0, -32768, 32767);
                    pWav->msadpcm.delta[0] = (adaptationTable[((nibbles & 0xF0) >> 4)] * pWav->msadpcm.delta[0]) >> 8;
                    if (pWav->msadpcm.delta[0] < 16) {
                        pWav->msadpcm.delta[0] = 16;
                    }
                    pWav->msadpcm.prevFrames[0][0] = pWav->msadpcm.prevFrames[0][1];
                    pWav->msadpcm.prevFrames[0][1] = newSample0;
                    newSample1  = ((pWav->msadpcm.prevFrames[1][1] * coeff1Table[pWav->msadpcm.predictor[1]]) + (pWav->msadpcm.prevFrames[1][0] * coeff2Table[pWav->msadpcm.predictor[1]])) >> 8;
                    newSample1 += nibble1 * pWav->msadpcm.delta[1];
                    newSample1  = ma_dr_wav_clamp(newSample1, -32768, 32767);
                    pWav->msadpcm.delta[1] = (adaptationTable[((nibbles & 0x0F) >> 0)] * pWav->msadpcm.delta[1]) >> 8;
                    if (pWav->msadpcm.delta[1] < 16) {
                        pWav->msadpcm.delta[1] = 16;
                    }
                    pWav->msadpcm.prevFrames[1][0] = pWav->msadpcm.prevFrames[1][1];
                    pWav->msadpcm.prevFrames[1][1] = newSample1;
                    pWav->msadpcm.cachedFrames[2] = newSample0;
                    pWav->msadpcm.cachedFrames[3] = newSample1;
                    pWav->msadpcm.cachedFrameCount = 1;
                }
            }
        }
    }
    return totalFramesRead;
}